

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_mesh_builder.cxx
# Opt level: O2

void xray_re::xr_mesh_builder::create_unique_array<xray_re::_vector3<float>>
               (b_proxy_vec *refs,
               vector<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_> *data,
               _vector3<float> *raw_data,uint32_t *mapping)

{
  uint uVar1;
  pointer pbVar2;
  pointer pbVar3;
  bool bVar4;
  pointer pbVar5;
  uint32_t uVar6;
  
  std::
  __sort<__gnu_cxx::__normal_iterator<xray_re::xr_mesh_builder::b_proxy*,std::vector<xray_re::xr_mesh_builder::b_proxy,std::allocator<xray_re::xr_mesh_builder::b_proxy>>>,__gnu_cxx::__ops::_Iter_comp_iter<xray_re::xr_mesh_builder::b_proxy::less<xray_re::_vector3<float>>>>
            ((refs->
             super__Vector_base<xray_re::xr_mesh_builder::b_proxy,_std::allocator<xray_re::xr_mesh_builder::b_proxy>_>
             )._M_impl.super__Vector_impl_data._M_start,
             (refs->
             super__Vector_base<xray_re::xr_mesh_builder::b_proxy,_std::allocator<xray_re::xr_mesh_builder::b_proxy>_>
             )._M_impl.super__Vector_impl_data._M_finish,
             (_Iter_comp_iter<xray_re::xr_mesh_builder::b_proxy::less<xray_re::_vector3<float>_>_>)
             raw_data);
  pbVar5 = (refs->
           super__Vector_base<xray_re::xr_mesh_builder::b_proxy,_std::allocator<xray_re::xr_mesh_builder::b_proxy>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (refs->
           super__Vector_base<xray_re::xr_mesh_builder::b_proxy,_std::allocator<xray_re::xr_mesh_builder::b_proxy>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  uVar6 = 0;
  do {
    if (pbVar5 == pbVar2) {
      return;
    }
    uVar1 = pbVar5->index;
    std::vector<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>::push_back
              (data,raw_data + uVar1);
    pbVar3 = pbVar5;
    do {
      pbVar5 = pbVar3 + 1;
      mapping[pbVar3->index] = uVar6;
      if (pbVar5 == pbVar2) break;
      bVar4 = _vector3<float>::operator==(raw_data + pbVar5->index,raw_data + uVar1);
      pbVar3 = pbVar5;
    } while (bVar4);
    uVar6 = uVar6 + 1;
  } while( true );
}

Assistant:

void
xr_mesh_builder::create_unique_array(b_proxy_vec& refs, std::vector<T>& data, const T* raw_data, uint32_t* mapping)
{
	std::sort(refs.begin(), refs.end(), b_proxy::less<T>(raw_data));
	uint32_t index = 0;
	for (b_proxy_vec_it it = refs.begin(), end = refs.end(); it != end; ++index) {
		const T& value = raw_data[it->index];
		data.push_back(value);
		mapping[it->index] = index;
		while (++it != end && raw_data[it->index] == value)
			mapping[it->index] = index;
	}
}